

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::DGXMLScanner::scanStartTagNS(DGXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  XMLBuffer *toFill;
  XMLSize_t XVar1;
  Grammar *pGVar2;
  XMLValidator *pXVar3;
  XMLDocumentHandler *pXVar4;
  bool *pbVar5;
  bool bVar6;
  XMLCh XVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  DTDElementDecl *this_01;
  DTDAttDef *attDef;
  XMLAttr *this_02;
  uint *puVar10;
  XMLSize_t XVar11;
  undefined4 extraout_var_00;
  XMLCh *pXVar12;
  UnexpectedEOFException *this_03;
  XMLCh *pXVar13;
  ulong attCount;
  AttTypes type;
  uint uVar14;
  XMLAttr *curAtt;
  bool *local_98;
  XMLBuffer *local_90;
  XMLCh *local_88;
  int colonPosition;
  ElemStack *local_78;
  XMLCh *local_70;
  DTDElementDecl *local_68;
  XMLCh *local_60;
  DTDAttDef *local_58;
  XMLSize_t local_50;
  bool *local_48;
  XMLSize_t local_40;
  XMLBuffer *local_38;
  
  *gotData = true;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  toFill = &(this->super_XMLScanner).fQNameBuf;
  bVar6 = ReaderMgr::getQName(this_00,toFill,&colonPosition);
  if (!bVar6) {
    XVar1 = toFill->fIndex;
    if (XVar1 == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    }
    else {
      pXVar12 = (this->super_XMLScanner).fQNameBuf.fBuffer;
      pXVar12[XVar1] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidElementName,pXVar12,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    ReaderMgr::skipToChar(this_00,L'<');
    return false;
  }
  XVar1 = (this->super_XMLScanner).fElemStack.fStackTop;
  pXVar12 = (this->super_XMLScanner).fQNameBuf.fBuffer;
  pXVar12[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
  pGVar2 = (this->super_XMLScanner).fGrammar;
  iVar8 = (*(pGVar2->super_XSerializable)._vptr_XSerializable[0xb])
                    (pGVar2,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0);
  this_01 = (DTDElementDecl *)CONCAT44(extraout_var,iVar8);
  if ((this_01 == (DTDElementDecl *)0x0) &&
     (this_01 = NameIdPool<xercesc_4_0::DTDElementDecl>::getByKey(this->fDTDElemNonDeclPool,pXVar12)
     , this_01 == (DTDElementDecl *)0x0)) {
    local_90 = (XMLBuffer *)(this->super_XMLScanner).fMemoryManager;
    this_01 = (DTDElementDecl *)XMemory::operator_new(0x58,(MemoryManager *)local_90);
    DTDElementDecl::DTDElementDecl
              (this_01,pXVar12,(this->super_XMLScanner).fEmptyNamespaceId,Any,
               (this->super_XMLScanner).fMemoryManager);
    XVar11 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_01);
    (this_01->super_XMLElementDecl).fId = XVar11;
    local_98 = &(this->super_XMLScanner).fValidate;
    if ((this->super_XMLScanner).fValidate == false) goto LAB_0029e74f;
    (this_01->super_XMLElementDecl).fCreateReason = JustFaultIn;
LAB_0029e725:
    local_98 = &(this->super_XMLScanner).fValidate;
    XMLValidator::emitError
              ((this->super_XMLScanner).fValidator,ElementNotDefined,pXVar12,(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0);
  }
  else {
    local_98 = &(this->super_XMLScanner).fValidate;
    if ((this->super_XMLScanner).fValidate == false) goto LAB_0029e74f;
    if ((this_01->super_XMLElementDecl).fCreateReason != Declared) goto LAB_0029e725;
  }
  pXVar3 = (this->super_XMLScanner).fValidator;
  (*pXVar3->_vptr_XMLValidator[9])(pXVar3,this_01);
LAB_0029e74f:
  local_78 = &(this->super_XMLScanner).fElemStack;
  ElemStack::addLevel(local_78,&this_01->super_XMLElementDecl,
                      ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum);
  local_50 = XVar1;
  local_48 = gotData;
  if (XVar1 == 0) {
    (this->super_XMLScanner).fRootGrammar = (this->super_XMLScanner).fGrammar;
    if ((((this->super_XMLScanner).fValidate == true) &&
        (pXVar13 = (this->super_XMLScanner).fRootElemName, pXVar13 != (XMLCh *)0x0)) &&
       (bVar6 = XMLString::equals(pXVar12,pXVar13), !bVar6)) {
      XMLValidator::emitError((this->super_XMLScanner).fValidator,RootElemNotLikeDocType);
    }
  }
  else if (*local_98 == true) {
    ElemStack::addChild(local_78,(this_01->super_XMLElementDecl).fElementName,true);
  }
  local_70 = pXVar12;
  ReaderMgr::skipPastSpaces(this_00);
  local_40 = (((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).
             fCurCount;
  this->fElemCount = this->fElemCount + 1;
  local_90 = &(this->super_XMLScanner).fAttNameBuf;
  local_38 = &(this->super_XMLScanner).fAttValueBuf;
  attCount = 0;
  local_68 = this_01;
LAB_0029e81a:
  do {
    while( true ) {
      XVar7 = ReaderMgr::peekNextChar(this_00);
      if (((attCount != 0) && (XVar7 != L'/')) && (XVar7 != L'>')) {
        if ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)XVar7]
            < '\0') {
          ReaderMgr::skipPastSpaces(this_00);
          XVar7 = ReaderMgr::peekNextChar(this_00);
        }
        else {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
        }
      }
      uVar14 = (uint)(ushort)XVar7;
      if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[uVar14] & 0x10) == 0)
      break;
      if ((XVar7 == L'\"') || (uVar14 == 0x27)) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
        ReaderMgr::getNextChar(this_00);
        ReaderMgr::skipQuotedString(this_00,XVar7);
        ReaderMgr::skipPastSpaces(this_00);
      }
      else {
        if (uVar14 == 0x2f) {
          ReaderMgr::getNextChar(this_00);
          bVar6 = ReaderMgr::skippedChar(this_00,L'>');
          uVar14 = 1;
          if (bVar6) goto LAB_0029ecf1;
          pXVar12 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
LAB_0029ecd9:
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar12,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
LAB_0029ecf1:
          if (attCount != 0) {
            scanAttrListforNameSpaces
                      (this,(this->super_XMLScanner).fAttrList,attCount,
                       &this_01->super_XMLElementDecl);
            Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
          }
          XVar11 = buildAttList(this,attCount,&this_01->super_XMLElementDecl,
                                (this->super_XMLScanner).fAttrList);
          XVar1 = local_50;
          if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
            bVar6 = local_50 == 0;
            uVar9 = XMLScanner::resolvePrefix
                              (&this->super_XMLScanner,
                               ((this_01->super_XMLElementDecl).fElementName)->fPrefix,Mode_Element)
            ;
            pXVar4 = (this->super_XMLScanner).fDocHandler;
            (*pXVar4->_vptr_XMLDocumentHandler[0xb])
                      (pXVar4,this_01,(ulong)uVar9,
                       ((this_01->super_XMLElementDecl).fElementName)->fPrefix,
                       (this->super_XMLScanner).fAttrList,XVar11,(ulong)uVar14,(ulong)bVar6);
          }
          pbVar5 = local_48;
          pXVar12 = local_70;
          if ((char)uVar14 != '\0') {
            if ((*local_98 == true) &&
               (pXVar3 = (this->super_XMLScanner).fValidator,
               iVar8 = (*pXVar3->_vptr_XMLValidator[2])(pXVar3,this_01,0,0), (char)iVar8 == '\0')) {
              pXVar3 = (this->super_XMLScanner).fValidator;
              iVar8 = (*(this_01->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd]
                      )(this_01);
              XMLValidator::emitError
                        (pXVar3,ElementNotValidForContent,pXVar12,
                         (XMLCh *)CONCAT44(extraout_var_00,iVar8),(XMLCh *)0x0,(XMLCh *)0x0);
            }
            ElemStack::popTop(local_78);
            if (XVar1 == 0) {
              *pbVar5 = false;
              return true;
            }
            return true;
          }
          return true;
        }
        if (uVar14 == 0x3c) {
          pXVar12 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
          uVar14 = 0;
          goto LAB_0029ecd9;
        }
        if (uVar14 == 0x3e) {
          ReaderMgr::getNextChar(this_00);
          uVar14 = 0;
          goto LAB_0029ecf1;
        }
        if (uVar14 == 0) {
          this_03 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
          UnexpectedEOFException::UnexpectedEOFException
                    (this_03,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                     ,0x745,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
          __cxa_throw(this_03,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
        }
      }
    }
    bVar6 = ReaderMgr::getQName(this_00,local_90,&colonPosition);
    if (!bVar6) {
      if (local_90->fIndex == 0) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
      }
      else {
        pXVar12 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
        pXVar12[local_90->fIndex] = L'\0';
        XMLScanner::emitError
                  (&this->super_XMLScanner,InvalidAttrName,pXVar12,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      ReaderMgr::skipPastChar(this_00,L'>');
      return false;
    }
    bVar6 = XMLScanner::scanEq(&this->super_XMLScanner,false);
    if (!bVar6) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
      XVar7 = ReaderMgr::skipUntilInOrWS(this_00,L"\'\"></");
      if ((XVar7 == L'/') || (XVar7 == L'>')) goto LAB_0029e81a;
      if ((XVar7 != L'\"') &&
         ((XVar7 != L'\'' &&
          (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                      [(ushort)XVar7])))) goto joined_r0x0029ee20;
    }
    pXVar12 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
    pXVar12[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
    attDef = DTDElementDecl::getAttDef(this_01,pXVar12);
    ReaderMgr::skipPastSpaces(this_00);
    bVar6 = scanAttValue(this,&attDef->super_XMLAttDef,pXVar12,local_38);
    if (!bVar6) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
      XVar7 = ReaderMgr::skipUntilInOrWS(this_00,L"></");
      if (((XVar7 != L'/') && (XVar7 != L'>')) &&
         (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                     [(ushort)XVar7])) {
joined_r0x0029ee20:
        if (XVar7 != L'<') {
          return false;
        }
        pXVar12 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
        XMLScanner::emitError
                  (&this->super_XMLScanner,UnterminatedStartTag,pXVar12,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        return false;
      }
    }
    local_88 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
    local_88[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
    if (attCount < local_40) {
      curAtt = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                         (&((this->super_XMLScanner).fAttrList)->
                           super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,attCount);
    }
    else {
      local_60 = pXVar12;
      local_58 = attDef;
      this_02 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
      XMLAttr::XMLAttr(this_02,(this->super_XMLScanner).fMemoryManager);
      curAtt = this_02;
      BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
                (&((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,
                 this_02);
      pXVar12 = local_60;
      attDef = local_58;
    }
    curAtt->fSpecified = true;
    if (attDef == (DTDAttDef *)0x0) {
      type = AttTypes_Min;
    }
    else {
      type = (attDef->super_XMLAttDef).fType;
    }
    XMLAttr::set(curAtt,(this->super_XMLScanner).fEmptyNamespaceId,pXVar12,L"",type,
                 (DatatypeValidator *)0x0,false);
    pXVar12 = curAtt->fAttName->fPrefix;
    pXVar13 = curAtt->fAttName->fLocalPart;
    if ((pXVar12 == (XMLCh *)0x0) || (*pXVar12 == L'\0')) {
      bVar6 = XMLString::equals((XMLCh *)XMLUni::fgXMLNSString,pXVar13);
      if (bVar6) {
        pXVar13 = L"";
LAB_0029eb44:
        updateNSMap(this,pXVar12,pXVar13,local_88);
      }
    }
    else {
      bVar6 = XMLString::equals(pXVar12,L"xml");
      if (bVar6) {
        XMLAttr::setURIId(curAtt,(this->super_XMLScanner).fXMLNamespaceId);
      }
      else {
        bVar6 = XMLString::equals(pXVar12,(XMLCh *)XMLUni::fgXMLNSString);
        if (bVar6) {
          XMLAttr::setURIId(curAtt,(this->super_XMLScanner).fXMLNSNamespaceId);
          goto LAB_0029eb44;
        }
        ValueVectorOf<xercesc_4_0::XMLAttr_*>::addElement(this->fAttrNSList,&curAtt);
      }
    }
    this_01 = local_68;
    if (attDef == (DTDAttDef *)0x0) {
      if (*local_98 != false) {
        pXVar12 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
        pXVar3 = (this->super_XMLScanner).fValidator;
        pXVar12[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
        XMLValidator::emitError
                  (pXVar3,AttNotDefinedForElement,pXVar12,local_70,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    else {
      puVar10 = RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::get
                          (this->fAttDefRegistry,attDef);
      this_01 = local_68;
      if (puVar10 == (uint *)0x0) {
        puVar10 = XMLScanner::getNewUIntPtr(&this->super_XMLScanner);
        *puVar10 = this->fElemCount;
        RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::put
                  (this->fAttDefRegistry,attDef,puVar10);
      }
      else if (*puVar10 < this->fElemCount) {
        *puVar10 = this->fElemCount;
      }
      if (*local_98 != false) {
        pXVar3 = (this->super_XMLScanner).fValidator;
        (this->super_XMLScanner).fAttValueBuf.fBuffer[(this->super_XMLScanner).fAttValueBuf.fIndex]
             = L'\0';
        (*pXVar3->_vptr_XMLValidator[8])(pXVar3,attDef);
      }
    }
    XMLAttr::setValue(curAtt,local_88);
    attCount = attCount + 1;
  } while( true );
}

Assistant:

bool DGXMLScanner::scanStartTagNS(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.

    int  colonPosition;
    bool validName = fReaderMgr.getQName(fQNameBuf, &colonPosition);
    if (!validName)
    {
        if (fQNameBuf.isEmpty())
            emitError(XMLErrs::ExpectedElementName);
        else
            emitError(XMLErrs::InvalidElementName, fQNameBuf.getRawBuffer());
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    //  Lets try to look up the element in the validator's element decl pool
    //  We can pass bogus values for the URI id and the base name. We know that
    //  this can only be called if we are doing a DTD style validator and that
    //  he will only look at the QName.
    //
    //  We *do not* tell him to fault in a decl if he does not find one - NG.
    bool wasAdded = false;
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();

    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        fEmptyNamespaceId
        , 0
        , qnameRawBuf
        , Grammar::TOP_LEVEL_SCOPE
    );
    // look in the undeclared pool:
    if(!elemDecl)
    {
        elemDecl = fDTDElemNonDeclPool->getByKey(qnameRawBuf);
    }
    if(!elemDecl)
    {
        wasAdded = true;
        elemDecl = new (fMemoryManager) DTDElementDecl
        (
            qnameRawBuf
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fMemoryManager
        );
        elemDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)elemDecl));
    }

    if (fValidate) {

        if (wasAdded)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the validator pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }
        // If its not marked declared, then emit an error
        else if (!elemDecl->isDeclared())
        {
            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }


        fValidator->validateElement(elemDecl);
    }

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());

    //  If this is the first element and we are validating, check the root
    //  element.
    if (isRoot)
    {
        fRootGrammar = fGrammar;

        if (fValidate)
        {
            //  If a DocType exists, then check if it matches the root name there.
            if (fRootElemName && !XMLString::equals(qnameRawBuf, fRootElemName))
                fValidator->emitError(XMLValid::RootElemNotLikeDocType);
        }
    }
    else if (fValidate)
    {
        //  If the element stack is not empty, then add this element as a
        //  child of the previous top element. If its empty, this is the root
        //  elem and is not the child of anything.
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    wasAdded = false;

    fElemCount++;

    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    // Ok, skip by them and peek another char
                    fReaderMgr.skipPastSpaces();
                    nextCh = fReaderMgr.peekNextChar();
                }
                 else
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.

            validName = fReaderMgr.getQName(fAttNameBuf, &colonPosition);
            if (!validName)
            {
                if (fAttNameBuf.isEmpty())
                    emitError(XMLErrs::ExpectedAttrName);
                else
                    emitError(XMLErrs::InvalidAttrName, fAttNameBuf.getRawBuffer());
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  See if this attribute is declared for this element. If we are
            //  not validating of course it will not be at first, but we will
            //  fault it into the pool (to avoid lots of redundant errors.)
            XMLCh * namePtr = fAttNameBuf.getRawBuffer();
            XMLAttDef* attDef = ((DTDElementDecl *)elemDecl)->getAttDef(namePtr);

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attDef, namePtr, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            // Note that we want to this first since this will
            // make a copy of the namePtr; we can then make use of
            // that copy in the hashtable lookup that checks
            // for duplicates.  This will mean we may have to update
            // the type of the XMLAttr later.
            XMLAttr* curAtt;
            const XMLCh* attrValue = fAttValueBuf.getRawBuffer();

            if (attCount >= curAttListSize) {
                curAtt = new (fMemoryManager) XMLAttr(fMemoryManager);
                fAttrList->addElement(curAtt);
            }
            else {
                curAtt = fAttrList->elementAt(attCount);
            }

            curAtt->setSpecified(true);
            // DO NAMESPACES
            {
                curAtt->set(
                    fEmptyNamespaceId, namePtr, XMLUni::fgZeroLenString
                    , (attDef)? attDef->getType() : XMLAttDef::CData
                );

                // each attribute has the prefix:suffix="value"
                const XMLCh* attPrefix = curAtt->getPrefix();
                const XMLCh* attLocalName = curAtt->getName();

                if (attPrefix && *attPrefix) {
                    if (XMLString::equals(attPrefix, XMLUni::fgXMLString)) {
                        curAtt->setURIId(fXMLNamespaceId);
                    }
                    else if (XMLString::equals(attPrefix, XMLUni::fgXMLNSString)) {
                        curAtt->setURIId(fXMLNSNamespaceId);
                        updateNSMap(attPrefix, attLocalName, attrValue);
                    }
                    else {
                        fAttrNSList->addElement(curAtt);
                    }
                }
                else if (XMLString::equals(XMLUni::fgXMLNSString, attLocalName))
                {
                    updateNSMap(attPrefix, XMLUni::fgZeroLenString, attrValue);
                }

                // NOTE: duplicate attribute check will be done, when we map
                //       namespaces to all attributes
                if (attDef) {
                    unsigned int *curCountPtr = fAttDefRegistry->get(attDef);
                    if (!curCountPtr) {
                        curCountPtr = getNewUIntPtr();
                        *curCountPtr = fElemCount;
                        fAttDefRegistry->put(attDef, curCountPtr);
                   }
                    else if (*curCountPtr < fElemCount) {
                        *curCountPtr = fElemCount;
                    }
                }
            }

            if (fValidate)
            {
                if (attDef) {
                    // Let the validator pass judgement on the attribute value
                    fValidator->validateAttrValue(
                        attDef, fAttValueBuf.getRawBuffer(), false, elemDecl
                    );
                }
                else
                {
                    fValidator->emitError
                    (
                        XMLValid::AttNotDefinedForElement
                        , fAttNameBuf.getRawBuffer(), qnameRawBuf
                    );
                }
            }

            // must set the newly-minted value on the XMLAttr:
            curAtt->setValue(attrValue);
            attCount++;

            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    //  Make an initial pass through the list and find any xmlns attributes.
    if (attCount)
      scanAttrListforNameSpaces(fAttrList, attCount, elemDecl);

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    //  Now lets get the fAttrList filled in. This involves faulting in any
    //  defaulted and fixed attributes and normalizing the values of any that
    //  we got explicitly.
    //
    //  We update the attCount value with the total number of attributes, but
    //  it goes in with the number of values we got during the raw scan of
    //  explictly provided attrs above.
    attCount = buildAttList(attCount, elemDecl, *fAttrList);

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    if (fDocHandler)
    {
        unsigned int uriId = resolvePrefix
            (
                elemDecl->getElementName()->getPrefix()
                , ElemStack::Mode_Element
            );

        fDocHandler->startElement
        (
            *elemDecl
            , uriId
            , elemDecl->getElementName()->getPrefix()
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , qnameRawBuf
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
    }

    return true;
}